

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::optional<dap::Source>_>::construct
          (BasicTypeInfo<dap::optional<dap::Source>_> *this,void *ptr)

{
  vector<dap::any,_std::allocator<dap::any>_> local_28;
  
  memset((void *)((long)ptr + 0x18),0,0x120);
  local_28.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_28.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_28.super__Vector_base<dap::any,_std::allocator<dap::any>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)((long)ptr + 0x10) = 0;
  *(undefined8 *)ptr = 0;
  *(undefined8 *)((long)ptr + 8) = 0;
  any::operator=((any *)ptr,&local_28);
  std::vector<dap::any,_std::allocator<dap::any>_>::~vector(&local_28);
  *(undefined1 *)((long)ptr + 0x38) = 0;
  *(undefined8 *)((long)ptr + 0x60) = 0;
  *(undefined8 *)((long)ptr + 0x68) = 0;
  *(undefined8 *)((long)ptr + 0x40) = 0;
  *(undefined8 *)((long)ptr + 0x48) = 0;
  *(undefined8 *)((long)ptr + 0x50) = 0;
  *(undefined8 *)((long)ptr + 0x58) = 0;
  *(undefined8 *)((long)ptr + 0x70) = 0;
  *(undefined8 *)((long)ptr + 0x78) = 0;
  *(undefined8 *)((long)ptr + 0x80) = 0;
  *(long *)((long)ptr + 0x60) = (long)ptr + 0x70;
  *(undefined8 *)((long)ptr + 0x98) = 0;
  *(undefined8 *)((long)ptr + 0xa0) = 0;
  *(undefined8 *)((long)ptr + 0xa8) = 0;
  *(long *)((long)ptr + 0x88) = (long)ptr + 0x98;
  *(undefined8 *)((long)ptr + 0x90) = 0;
  *(undefined8 *)((long)ptr + 0xc0) = 0;
  *(undefined8 *)((long)ptr + 200) = 0;
  *(undefined8 *)((long)ptr + 0xd0) = 0;
  *(long *)((long)ptr + 0xb0) = (long)ptr + 0xc0;
  *(undefined8 *)((long)ptr + 0xb8) = 0;
  *(undefined8 *)((long)ptr + 0xe8) = 0;
  *(undefined8 *)((long)ptr + 0xf0) = 0;
  *(undefined8 *)((long)ptr + 0xf8) = 0;
  *(long *)((long)ptr + 0xd8) = (long)ptr + 0xe8;
  *(undefined8 *)((long)ptr + 0xe0) = 0;
  *(undefined1 *)((long)ptr + 0x130) = 0;
  *(undefined8 *)((long)ptr + 0x120) = 0;
  *(undefined8 *)((long)ptr + 0x128) = 0;
  *(undefined8 *)((long)ptr + 0x110) = 0;
  *(undefined8 *)((long)ptr + 0x118) = 0;
  *(undefined8 *)((long)ptr + 0x100) = 0;
  *(undefined8 *)((long)ptr + 0x108) = 0;
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }